

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_remove_indexBeyoundBounds_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *expr;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"01234567",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  AString_remove(&string,8,1);
  AString_remove(&string,0x29a,0x2a);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1e6);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar5 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) (string).buffer != NULL";
      pcVar4 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x1e6);
      pcVar5 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar5 = "(null)";
      }
      else {
        iVar1 = strcmp("01234567",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1e6);
          if (string.size == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x1e6);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x1e7);
              (*string.deallocator)(string.buffer);
              return;
            }
            pcVar5 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x1e7;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_00123aa0;
          }
          pcVar5 = "strlen(\"01234567\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar3 = "(string).size == strlen(\"01234567\")";
          pcVar4 = "(string).size";
          goto LAB_00123a9b;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar3 = "(string).buffer == (\"01234567\")";
      pcVar4 = "(string).buffer";
    }
  }
  else {
    pcVar5 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar3 = "(string).capacity == (8)";
    pcVar4 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_00123a9b:
  iVar1 = 0x1e6;
LAB_00123aa0:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar2,pcVar3,pcVar4,string.size,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_AString_remove_indexBeyoundBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234567", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = 0;
    AString_remove(&string, 8, 1);
    AString_remove(&string, 666, 42);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}